

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType>::TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType> *this,
          TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType> *param_1)

{
  bool bVar1;
  undefined3 uVar2;
  ElementType EVar3;
  
  AttrMetas::AttrMetas(&this->_metas,&param_1->_metas);
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&this->_paths,
             (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&param_1->_paths);
  bVar1 = (param_1->_attrib).has_value_;
  (this->_attrib).has_value_ = bVar1;
  if (bVar1 == true) {
    (this->_attrib).contained = (param_1->_attrib).contained;
  }
  this->_blocked = param_1->_blocked;
  uVar2 = *(undefined3 *)&param_1->field_0x229;
  EVar3 = param_1->_fallback;
  this->_empty = param_1->_empty;
  *(undefined3 *)&this->field_0x229 = uVar2;
  this->_fallback = EVar3;
  return;
}

Assistant:

static uint32_t type_id() { return value::TypeTraits<T>::type_id(); }